

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_null.cpp
# Opt level: O0

void __thiscall driver::context_t::context_t(context_t *this)

{
  _func__ze_result_t_uint32_t_ptr_ze_driver_handle_t_ptr *p_Var1;
  _func__ze_result_t_ze_driver_handle_t_uint32_t_ptr_ze_device_handle_t_ptr *p_Var2;
  _func__ze_result_t_ze_driver_handle_t_ze_api_version_t_ptr *p_Var3;
  _func__ze_result_t_ze_driver_handle_t_ze_driver_properties_t_ptr *p_Var4;
  _func__ze_result_t_ze_context_handle_t_ze_device_mem_alloc_desc_t_ptr_ze_host_mem_alloc_desc_t_ptr_size_t_size_t_ze_device_handle_t_void_ptr_ptr
  *p_Var5;
  _func__ze_result_t_ze_context_handle_t_ze_device_mem_alloc_desc_t_ptr_size_t_size_t_ze_device_handle_t_void_ptr_ptr
  *p_Var6;
  _func__ze_result_t_ze_context_handle_t_ze_host_mem_alloc_desc_t_ptr_size_t_size_t_void_ptr_ptr
  *p_Var7;
  _func__ze_result_t_ze_context_handle_t_void_ptr *p_Var8;
  _func__ze_result_t_ze_device_handle_t_ze_device_properties_t_ptr *p_Var9;
  _func__ze_result_t_ze_device_handle_t_ze_device_compute_properties_t_ptr *p_Var10;
  _func__ze_result_t_ze_device_handle_t_uint32_t_ptr_ze_command_queue_group_properties_t_ptr
  *p_Var11;
  _func__ze_result_t_ze_device_handle_t_uint32_t_ptr_ze_device_memory_properties_t_ptr *p_Var12;
  _func__ze_result_t_ze_device_handle_t_ze_device_memory_access_properties_t_ptr *p_Var13;
  _func__ze_result_t_ze_device_handle_t_uint32_t_ptr_ze_device_cache_properties_t_ptr *p_Var14;
  _func__ze_result_t_ze_device_handle_t_ze_device_image_properties_t_ptr *p_Var15;
  _func__ze_result_t_ze_driver_handle_t_uint32_t_ptr_ze_driver_extension_properties_t_ptr *p_Var16;
  _func__ze_result_t_zet_device_handle_t_uint32_t_ptr_zet_metric_group_handle_t_ptr *p_Var17;
  _func__ze_result_t_zet_metric_group_handle_t_zet_metric_group_properties_t_ptr *p_Var18;
  _func__ze_result_t_zet_metric_group_handle_t_zet_metric_group_calculation_type_t_size_t_uint8_t_ptr_uint32_t_ptr_zet_typed_value_t_ptr
  *p_Var19;
  _func__ze_result_t_zet_metric_group_handle_t_uint32_t_ptr_zet_metric_handle_t_ptr *p_Var20;
  _func__ze_result_t_zet_metric_handle_t_zet_metric_properties_t_ptr *p_Var21;
  _func__ze_result_t_zet_metric_query_handle_t_size_t_ptr_uint8_t_ptr *p_Var22;
  _func__ze_result_t_zet_metric_streamer_handle_t_uint32_t_size_t_ptr_uint8_t_ptr *p_Var23;
  __23 local_28;
  __22 local_27;
  __21 local_26;
  __20 local_25;
  __19 local_24;
  __18 local_23;
  __17 local_22;
  __16 local_21;
  __15 local_20;
  __14 local_1f;
  __13 local_1e;
  __12 local_1d;
  __11 local_1c;
  __10 local_1b;
  __9 local_1a;
  __8 local_19;
  __7 local_18;
  __6 local_17;
  __5 local_16;
  __4 local_15;
  __3 local_14;
  __2 local_13;
  __1 local_12;
  __0 local_11;
  context_t *local_10;
  context_t *this_local;
  
  this->version = ZE_API_VERSION_1_13;
  local_10 = this;
  memset(&this->zeDdiTable,0,0x28);
  memset(&(this->zeDdiTable).RTASBuilderExp,0,0x20);
  memset(&(this->zeDdiTable).RTASParallelOperation,0,0x20);
  memset(&(this->zeDdiTable).RTASParallelOperationExp,0,0x20);
  (this->zeDdiTable).Global.pfnInit = (ze_pfnInit_t)0x0;
  (this->zeDdiTable).Global.pfnInitDrivers = (ze_pfnInitDrivers_t)0x0;
  memset(&(this->zeDdiTable).Driver,0,0x40);
  (this->zeDdiTable).DriverExp.pfnRTASFormatCompatibilityCheckExp =
       (ze_pfnDriverRTASFormatCompatibilityCheckExp_t)0x0;
  memset(&(this->zeDdiTable).Device,0,0xb0);
  (this->zeDdiTable).DeviceExp.pfnGetFabricVertexExp = (ze_pfnDeviceGetFabricVertexExp_t)0x0;
  memset(&(this->zeDdiTable).Context,0,0x48);
  memset(&(this->zeDdiTable).CommandQueue,0,0x30);
  memset(&(this->zeDdiTable).CommandList,0,0x120);
  memset(&(this->zeDdiTable).CommandListExp,0,0x40);
  memset(&(this->zeDdiTable).Image,0,0x28);
  memset(&(this->zeDdiTable).ImageExp,0,0x18);
  memset(&(this->zeDdiTable).Mem,0,0x60);
  memset(&(this->zeDdiTable).MemExp,0,0x20);
  memset(&(this->zeDdiTable).Fence,0,0x28);
  memset(&(this->zeDdiTable).EventPool,0,0x40);
  memset(&(this->zeDdiTable).Event,0,0x58);
  (this->zeDdiTable).EventExp.pfnQueryTimestampsExp = (ze_pfnEventQueryTimestampsExp_t)0x0;
  memset(&(this->zeDdiTable).Module,0,0x48);
  (this->zeDdiTable).ModuleBuildLog.pfnDestroy = (ze_pfnModuleBuildLogDestroy_t)0x0;
  (this->zeDdiTable).ModuleBuildLog.pfnGetString = (ze_pfnModuleBuildLogGetString_t)0x0;
  memset(&(this->zeDdiTable).Kernel,0,0x60);
  memset(&(this->zeDdiTable).KernelExp,0,0x18);
  (this->zeDdiTable).Sampler.pfnCreate = (ze_pfnSamplerCreate_t)0x0;
  (this->zeDdiTable).Sampler.pfnDestroy = (ze_pfnSamplerDestroy_t)0x0;
  (this->zeDdiTable).PhysicalMem.pfnCreate = (ze_pfnPhysicalMemCreate_t)0x0;
  (this->zeDdiTable).PhysicalMem.pfnDestroy = (ze_pfnPhysicalMemDestroy_t)0x0;
  memset(&(this->zeDdiTable).VirtualMem,0,0x38);
  memset(&(this->zeDdiTable).FabricVertexExp,0,0x20);
  memset(&(this->zeDdiTable).FabricEdgeExp,0,0x18);
  memset(&this->zetDdiTable,0,0x20);
  memset(&(this->zetDdiTable).MetricTracerExp,0,0x30);
  memset(&(this->zetDdiTable).MetricDecoderExp,0,0x18);
  (this->zetDdiTable).Device.pfnGetDebugProperties = (zet_pfnDeviceGetDebugProperties_t)0x0;
  memset(&(this->zetDdiTable).DeviceExp,0,0x20);
  (this->zetDdiTable).Context.pfnActivateMetricGroups = (zet_pfnContextActivateMetricGroups_t)0x0;
  memset(&(this->zetDdiTable).CommandList,0,0x20);
  (this->zetDdiTable).CommandListExp.pfnAppendMarkerExp = (zet_pfnCommandListAppendMarkerExp_t)0x0;
  (this->zetDdiTable).Module.pfnGetDebugInfo = (zet_pfnModuleGetDebugInfo_t)0x0;
  (this->zetDdiTable).Kernel.pfnGetProfileInfo = (zet_pfnKernelGetProfileInfo_t)0x0;
  (this->zetDdiTable).Metric.pfnGet = (zet_pfnMetricGet_t)0x0;
  (this->zetDdiTable).Metric.pfnGetProperties = (zet_pfnMetricGetProperties_t)0x0;
  memset(&(this->zetDdiTable).MetricExp,0,0x18);
  memset(&(this->zetDdiTable).MetricGroup,0,0x18);
  memset(&(this->zetDdiTable).MetricGroupExp,0,0x48);
  memset(&(this->zetDdiTable).MetricStreamer,0,0x18);
  (this->zetDdiTable).MetricQueryPool.pfnCreate = (zet_pfnMetricQueryPoolCreate_t)0x0;
  (this->zetDdiTable).MetricQueryPool.pfnDestroy = (zet_pfnMetricQueryPoolDestroy_t)0x0;
  memset(&(this->zetDdiTable).MetricQuery,0,0x20);
  memset(&(this->zetDdiTable).TracerExp,0,0x28);
  memset(&(this->zetDdiTable).Debug,0,0x60);
  (this->zesDdiTable).Global.pfnInit = (zes_pfnInit_t)0x0;
  memset(&(this->zesDdiTable).Device,0,0x128);
  memset(&(this->zesDdiTable).DeviceExp,0,0x18);
  memset(&(this->zesDdiTable).Driver,0,0x28);
  (this->zesDdiTable).DriverExp.pfnGetDeviceByUuidExp = (zes_pfnDriverGetDeviceByUuidExp_t)0x0;
  memset(&(this->zesDdiTable).Overclock,0,0x48);
  memset(&(this->zesDdiTable).Scheduler,0,0x40);
  memset(&(this->zesDdiTable).PerformanceFactor,0,0x18);
  memset(&(this->zesDdiTable).Power,0,0x40);
  memset(&(this->zesDdiTable).Frequency,0,0x88);
  memset(&(this->zesDdiTable).Engine,0,0x18);
  memset(&(this->zesDdiTable).Standby,0,0x18);
  memset(&(this->zesDdiTable).Firmware,0,0x20);
  (this->zesDdiTable).FirmwareExp.pfnGetSecurityVersionExp =
       (zes_pfnFirmwareGetSecurityVersionExp_t)0x0;
  (this->zesDdiTable).FirmwareExp.pfnSetSecurityVersionExp =
       (zes_pfnFirmwareSetSecurityVersionExp_t)0x0;
  memset(&(this->zesDdiTable).Memory,0,0x18);
  memset(&(this->zesDdiTable).FabricPort,0,0x40);
  memset(&(this->zesDdiTable).Temperature,0,0x20);
  (this->zesDdiTable).Psu.pfnGetProperties = (zes_pfnPsuGetProperties_t)0x0;
  (this->zesDdiTable).Psu.pfnGetState = (zes_pfnPsuGetState_t)0x0;
  memset(&(this->zesDdiTable).Fan,0,0x30);
  memset(&(this->zesDdiTable).Led,0,0x20);
  memset(&(this->zesDdiTable).Ras,0,0x20);
  (this->zesDdiTable).RasExp.pfnGetStateExp = (zes_pfnRasGetStateExp_t)0x0;
  (this->zesDdiTable).RasExp.pfnClearStateExp = (zes_pfnRasClearStateExp_t)0x0;
  memset(&(this->zesDdiTable).Diagnostics,0,0x18);
  memset(&(this->zesDdiTable).VFManagementExp,0,0x48);
  p_Var1 = context_t()::$_0::operator_cast_to_function_pointer(&local_11);
  (this->zesDdiTable).Driver.pfnGet = (zes_pfnDriverGet_t)p_Var1;
  p_Var1 = context_t()::$_1::operator_cast_to_function_pointer(&local_12);
  (this->zeDdiTable).Driver.pfnGet = (ze_pfnDriverGet_t)p_Var1;
  p_Var2 = context_t()::$_2::operator_cast_to_function_pointer(&local_13);
  (this->zeDdiTable).Device.pfnGet = (ze_pfnDeviceGet_t)p_Var2;
  p_Var3 = context_t()::$_3::operator_cast_to_function_pointer(&local_14);
  (this->zeDdiTable).Driver.pfnGetApiVersion = (ze_pfnDriverGetApiVersion_t)p_Var3;
  p_Var4 = context_t()::$_4::operator_cast_to_function_pointer(&local_15);
  (this->zeDdiTable).Driver.pfnGetProperties = (ze_pfnDriverGetProperties_t)p_Var4;
  p_Var5 = context_t()::$_5::operator_cast_to_function_pointer(&local_16);
  (this->zeDdiTable).Mem.pfnAllocShared = (ze_pfnMemAllocShared_t)p_Var5;
  p_Var6 = context_t()::$_6::operator_cast_to_function_pointer(&local_17);
  (this->zeDdiTable).Mem.pfnAllocDevice = (ze_pfnMemAllocDevice_t)p_Var6;
  p_Var7 = context_t()::$_7::operator_cast_to_function_pointer(&local_18);
  (this->zeDdiTable).Mem.pfnAllocHost = (ze_pfnMemAllocHost_t)p_Var7;
  p_Var8 = context_t()::$_8::operator_cast_to_function_pointer(&local_19);
  (this->zeDdiTable).Mem.pfnFree = (ze_pfnMemFree_t)p_Var8;
  p_Var9 = context_t()::$_9::operator_cast_to_function_pointer(&local_1a);
  (this->zeDdiTable).Device.pfnGetProperties = (ze_pfnDeviceGetProperties_t)p_Var9;
  p_Var10 = context_t()::$_10::operator_cast_to_function_pointer(&local_1b);
  (this->zeDdiTable).Device.pfnGetComputeProperties = (ze_pfnDeviceGetComputeProperties_t)p_Var10;
  p_Var11 = context_t()::$_11::operator_cast_to_function_pointer(&local_1c);
  (this->zeDdiTable).Device.pfnGetCommandQueueGroupProperties =
       (ze_pfnDeviceGetCommandQueueGroupProperties_t)p_Var11;
  p_Var12 = context_t()::$_12::operator_cast_to_function_pointer(&local_1d);
  (this->zeDdiTable).Device.pfnGetMemoryProperties = (ze_pfnDeviceGetMemoryProperties_t)p_Var12;
  p_Var13 = context_t()::$_13::operator_cast_to_function_pointer(&local_1e);
  (this->zeDdiTable).Device.pfnGetMemoryAccessProperties =
       (ze_pfnDeviceGetMemoryAccessProperties_t)p_Var13;
  p_Var14 = context_t()::$_14::operator_cast_to_function_pointer(&local_1f);
  (this->zeDdiTable).Device.pfnGetCacheProperties = (ze_pfnDeviceGetCacheProperties_t)p_Var14;
  p_Var15 = context_t()::$_15::operator_cast_to_function_pointer(&local_20);
  (this->zeDdiTable).Device.pfnGetImageProperties = (ze_pfnDeviceGetImageProperties_t)p_Var15;
  p_Var16 = context_t()::$_16::operator_cast_to_function_pointer(&local_21);
  (this->zeDdiTable).Driver.pfnGetExtensionProperties =
       (ze_pfnDriverGetExtensionProperties_t)p_Var16;
  p_Var17 = context_t()::$_17::operator_cast_to_function_pointer(&local_22);
  (this->zetDdiTable).MetricGroup.pfnGet = (zet_pfnMetricGroupGet_t)p_Var17;
  p_Var18 = context_t()::$_18::operator_cast_to_function_pointer(&local_23);
  (this->zetDdiTable).MetricGroup.pfnGetProperties = (zet_pfnMetricGroupGetProperties_t)p_Var18;
  p_Var19 = context_t()::$_19::operator_cast_to_function_pointer(&local_24);
  (this->zetDdiTable).MetricGroup.pfnCalculateMetricValues =
       (zet_pfnMetricGroupCalculateMetricValues_t)p_Var19;
  p_Var20 = context_t()::$_20::operator_cast_to_function_pointer(&local_25);
  (this->zetDdiTable).Metric.pfnGet = (zet_pfnMetricGet_t)p_Var20;
  p_Var21 = context_t()::$_21::operator_cast_to_function_pointer(&local_26);
  (this->zetDdiTable).Metric.pfnGetProperties = (zet_pfnMetricGetProperties_t)p_Var21;
  p_Var22 = context_t()::$_22::operator_cast_to_function_pointer(&local_27);
  (this->zetDdiTable).MetricQuery.pfnGetData = (zet_pfnMetricQueryGetData_t)p_Var22;
  p_Var23 = context_t()::$_23::operator_cast_to_function_pointer(&local_28);
  (this->zetDdiTable).MetricStreamer.pfnReadData = (zet_pfnMetricStreamerReadData_t)p_Var23;
  return;
}

Assistant:

context_t::context_t()
    {
        zesDdiTable.Driver.pfnGet = [](
            uint32_t* pCount,
            ze_driver_handle_t* phDrivers )
        {
            *pCount = 1;
            if( nullptr != phDrivers ) *reinterpret_cast<void**>( phDrivers ) = context.get();
            return ZE_RESULT_SUCCESS;
        };
        //////////////////////////////////////////////////////////////////////////
        zeDdiTable.Driver.pfnGet = [](
            uint32_t* pCount,
            ze_driver_handle_t* phDrivers )
        {
            *pCount = 1;
            if( nullptr != phDrivers ) *reinterpret_cast<void**>( phDrivers ) = context.get();
            return ZE_RESULT_SUCCESS;
        };

        //////////////////////////////////////////////////////////////////////////
        zeDdiTable.Device.pfnGet = [](
            ze_driver_handle_t,
            uint32_t* pCount,
            ze_device_handle_t* phDevices )
        {
            *pCount = 1;
            if( nullptr != phDevices ) *reinterpret_cast<void**>( phDevices ) = context.get();
            return ZE_RESULT_SUCCESS;
        };

        //pfnCreateEventPool

        //////////////////////////////////////////////////////////////////////////
        zeDdiTable.Driver.pfnGetApiVersion = [](
            ze_driver_handle_t,
            ze_api_version_t* version )
        {
            *version = context.version;
            return ZE_RESULT_SUCCESS;
        };

        //////////////////////////////////////////////////////////////////////////
        zeDdiTable.Driver.pfnGetProperties = [](
            ze_driver_handle_t,
            ze_driver_properties_t* pDriverProperties )
        {
            ze_driver_properties_t driverProperties = {};
            driverProperties.stype = ZE_STRUCTURE_TYPE_DRIVER_PROPERTIES;
            //driverProperties.uuid
            driverProperties.driverVersion = 0;

            *pDriverProperties = driverProperties;
            return ZE_RESULT_SUCCESS;
        };

        //pfnGetIPCProperties
        
        //////////////////////////////////////////////////////////////////////////
        zeDdiTable.Mem.pfnAllocShared = [](
            ze_context_handle_t,
            const ze_device_mem_alloc_desc_t*,
            const ze_host_mem_alloc_desc_t*,
            size_t size,
            size_t alignment,
            ze_device_handle_t,
            void** pptr)
        {
            *pptr = malloc(size);
            return ZE_RESULT_SUCCESS;
        };

        //////////////////////////////////////////////////////////////////////////
        zeDdiTable.Mem.pfnAllocDevice = [](
            ze_context_handle_t,
            const ze_device_mem_alloc_desc_t*,
            size_t size,
            size_t alignment,
            ze_device_handle_t,
            void** pptr)
        {
            *pptr = malloc(size);
            return ZE_RESULT_SUCCESS;
        };

        //////////////////////////////////////////////////////////////////////////
        zeDdiTable.Mem.pfnAllocHost = [](
            ze_context_handle_t,
            const ze_host_mem_alloc_desc_t*,
            size_t size,
            size_t alignment,
            void** pptr)
        {
            *pptr = malloc(size);
            return ZE_RESULT_SUCCESS;
        };

        //////////////////////////////////////////////////////////////////////////
        zeDdiTable.Mem.pfnFree = [](
            ze_context_handle_t,
            void* ptr)
        {
            free(ptr);
            return ZE_RESULT_SUCCESS;
        };

        //pfnGetMemProperties
        //pfnGetMemAddressRange
        //pfnGetMemIpcHandle
        //pfnOpenMemIpcHandle
        //pfnCloseMemIpcHandle

        //////////////////////////////////////////////////////////////////////////
        //pfnGetSubDevices

        //////////////////////////////////////////////////////////////////////////
        zeDdiTable.Device.pfnGetProperties = [](
            ze_device_handle_t,
            ze_device_properties_t* pDeviceProperties )
        {
            ze_device_properties_t deviceProperties = {};
            deviceProperties.stype = ZE_STRUCTURE_TYPE_DEVICE_PROPERTIES;
            deviceProperties.type = ZE_DEVICE_TYPE_GPU;
            auto driver_type = getenv_string( "ZEL_TEST_NULL_DRIVER_TYPE" );
            if (std::strcmp(driver_type.c_str(), "NPU") == 0) {
                deviceProperties.type = ZE_DEVICE_TYPE_VPU;
            }
#if defined(_WIN32)
            strcpy_s( deviceProperties.name, "Null Device" );
#else
            strcpy( deviceProperties.name, "Null Device" );
#endif

            *pDeviceProperties = deviceProperties;
            return ZE_RESULT_SUCCESS;
        };

        //////////////////////////////////////////////////////////////////////////
        zeDdiTable.Device.pfnGetComputeProperties = [](
            ze_device_handle_t,
            ze_device_compute_properties_t* pComputeProperties )
        {
            ze_device_compute_properties_t computeProperties = {};
            computeProperties.stype = ZE_STRUCTURE_TYPE_DEVICE_COMPUTE_PROPERTIES;

            *pComputeProperties = computeProperties;
            return ZE_RESULT_SUCCESS;
        };

        //////////////////////////////////////////////////////////////////////////
        zeDdiTable.Device.pfnGetCommandQueueGroupProperties = [](
            ze_device_handle_t,
            uint32_t* pCount,
            ze_command_queue_group_properties_t* pCommandQueueGroupProperties )
        {
            if( nullptr != pCommandQueueGroupProperties )
            {
                ze_command_queue_group_properties_t commandQueueGroupProperties = {};
                commandQueueGroupProperties.stype = ZE_STRUCTURE_TYPE_COMMAND_QUEUE_GROUP_PROPERTIES;
                commandQueueGroupProperties.flags =
                    ZE_COMMAND_QUEUE_GROUP_PROPERTY_FLAG_COPY |
                    ZE_COMMAND_QUEUE_GROUP_PROPERTY_FLAG_COMPUTE;

                *pCommandQueueGroupProperties = commandQueueGroupProperties;
            }
            *pCount = 1;

            return ZE_RESULT_SUCCESS;
        };

        //////////////////////////////////////////////////////////////////////////
        zeDdiTable.Device.pfnGetMemoryProperties = [](
            ze_device_handle_t,
            uint32_t* pCount,
            ze_device_memory_properties_t* pMemProperties )
        {
            ze_device_memory_properties_t memoryProperties = {};
            memoryProperties.stype = ZE_STRUCTURE_TYPE_DEVICE_MEMORY_PROPERTIES;

            *pCount = 1;
            if( nullptr != pMemProperties ) *pMemProperties = memoryProperties;

            return ZE_RESULT_SUCCESS;
        };

        //////////////////////////////////////////////////////////////////////////
        zeDdiTable.Device.pfnGetMemoryAccessProperties = [](
            ze_device_handle_t,
            ze_device_memory_access_properties_t* pMemAccessProperties )
        {
            ze_device_memory_access_properties_t memoryAccessProperties = {};
            memoryAccessProperties.stype = ZE_STRUCTURE_TYPE_DEVICE_MEMORY_ACCESS_PROPERTIES;

            *pMemAccessProperties = memoryAccessProperties;
            return ZE_RESULT_SUCCESS;
        };

        //////////////////////////////////////////////////////////////////////////
        zeDdiTable.Device.pfnGetCacheProperties = [](
            ze_device_handle_t,
            uint32_t* pCount,
            ze_device_cache_properties_t* pCacheProperties )
        {
            if( nullptr != pCacheProperties )
            {
                ze_device_cache_properties_t cacheProperties = {};
                cacheProperties.stype = ZE_STRUCTURE_TYPE_DEVICE_CACHE_PROPERTIES;

                *pCacheProperties = cacheProperties;
            }
            *pCount = 1;

            return ZE_RESULT_SUCCESS;
        };

        //////////////////////////////////////////////////////////////////////////
        zeDdiTable.Device.pfnGetImageProperties = [](
            ze_device_handle_t,
            ze_device_image_properties_t* pImageProperties )
        {
            ze_device_image_properties_t imageProperties = {};
            imageProperties.stype = ZE_STRUCTURE_TYPE_DEVICE_IMAGE_PROPERTIES;

            *pImageProperties = imageProperties;
            return ZE_RESULT_SUCCESS;
        };

        //////////////////////////////////////////////////////////////////////////
        zeDdiTable.Driver.pfnGetExtensionProperties = [](
            ze_driver_handle_t,
            uint32_t* pCount,
            ze_driver_extension_properties_t* pExtensionProperties )
        {
            if( nullptr != pExtensionProperties )
            {
                ze_driver_extension_properties_t driverExtensionProperties = {};
#if defined(_WIN32)
                strcpy_s( driverExtensionProperties.name, ZET_API_TRACING_EXP_NAME );
#else
                strcpy( driverExtensionProperties.name, ZET_API_TRACING_EXP_NAME );
#endif
                driverExtensionProperties.version = ZET_API_TRACING_EXP_VERSION_1_0;

                *pExtensionProperties = driverExtensionProperties;
            }
            *pCount = 1;

            return ZE_RESULT_SUCCESS;
        };

        //////////////////////////////////////////////////////////////////////////
        zetDdiTable.MetricGroup.pfnGet = [](
            zet_device_handle_t,
            uint32_t* pCount,
            zet_metric_group_handle_t* phMetricGroups )
        {
            *pCount = 1;
            if( nullptr != phMetricGroups ) *reinterpret_cast<void**>( phMetricGroups ) = context.get();
            return ZE_RESULT_SUCCESS;
        };

        //////////////////////////////////////////////////////////////////////////
        zetDdiTable.MetricGroup.pfnGetProperties = [](
            zet_metric_group_handle_t,
            zet_metric_group_properties_t* pProperties )
        {
            zet_metric_group_properties_t metricGroupProperties = {};
            metricGroupProperties.stype = ZET_STRUCTURE_TYPE_METRIC_GROUP_PROPERTIES;
            metricGroupProperties.metricCount = 1;
            metricGroupProperties.samplingType = 
                ZET_METRIC_GROUP_SAMPLING_TYPE_FLAG_EVENT_BASED |
                ZET_METRIC_GROUP_SAMPLING_TYPE_FLAG_TIME_BASED;
#if defined(_WIN32)
            strcpy_s( metricGroupProperties.name, "Null Metric Group" );
#else
            strcpy( metricGroupProperties.name, "Null Metric Group" );
#endif

            *pProperties = metricGroupProperties;
            return ZE_RESULT_SUCCESS;
        };

        //////////////////////////////////////////////////////////////////////////
        zetDdiTable.MetricGroup.pfnCalculateMetricValues = [](
            zet_metric_group_handle_t,
            zet_metric_group_calculation_type_t,
            size_t,
            const uint8_t*,
            uint32_t* pMetricValueCount,
            zet_typed_value_t* pMetricValues )
        {
            *pMetricValueCount = 1;
            if( pMetricValues ) *pMetricValues = {};
            return ZE_RESULT_SUCCESS;
        };

        //////////////////////////////////////////////////////////////////////////
        zetDdiTable.Metric.pfnGet = [](
            zet_metric_group_handle_t,
            uint32_t* pCount,
            zet_metric_handle_t* phMetrics )
        {
            *pCount = 1;
            if( nullptr != phMetrics ) *reinterpret_cast<void**>( phMetrics ) = context.get();
            return ZE_RESULT_SUCCESS;
        };

        //////////////////////////////////////////////////////////////////////////
        zetDdiTable.Metric.pfnGetProperties = [](
            zet_metric_handle_t,
            zet_metric_properties_t* pProperties )
        {
            zet_metric_properties_t metricProperties = {};
            metricProperties.stype = ZET_STRUCTURE_TYPE_METRIC_PROPERTIES;
            metricProperties.metricType = ZET_METRIC_TYPE_DURATION;
            metricProperties.resultType = ZET_VALUE_TYPE_UINT32;
#if defined(_WIN32)
            strcpy_s( metricProperties.name, "Null Metric" );
            strcpy_s( metricProperties.resultUnits, "ns" );

#else
            strcpy( metricProperties.name, "Null Metric" );
            strcpy( metricProperties.resultUnits, "ns" );
#endif
            
            *pProperties = metricProperties;
            return ZE_RESULT_SUCCESS;
        };

        //////////////////////////////////////////////////////////////////////////
        zetDdiTable.MetricQuery.pfnGetData = [](
            zet_metric_query_handle_t,
            size_t* pRawDataSize,
            uint8_t* pRawData )
        {
            *pRawDataSize = 1;
            if( pRawData ) *pRawData = 0;
            return ZE_RESULT_SUCCESS;
        };

        //////////////////////////////////////////////////////////////////////////
        zetDdiTable.MetricStreamer.pfnReadData = [](
            zet_metric_streamer_handle_t,
            uint32_t,
            size_t* pRawDataSize,
            uint8_t* pRawData )
        {
            *pRawDataSize = 1;
            if( pRawData ) *pRawData = 0;
            return ZE_RESULT_SUCCESS;
        };
    }